

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_draw_list_path_last(nk_draw_list *list)

{
  void *pvVar1;
  long in_RDI;
  nk_vec2 *point;
  void *memory;
  
  pvVar1 = nk_buffer_memory(*(nk_buffer **)(in_RDI + 0xb0));
  return *(nk_vec2 *)
          ((long)pvVar1 + (ulong)(*(int *)(in_RDI + 0xe0) - 1) * 8 + (ulong)*(uint *)(in_RDI + 0xe4)
          );
}

Assistant:

NK_INTERN struct nk_vec2
nk_draw_list_path_last(struct nk_draw_list *list)
{
void *memory;
struct nk_vec2 *point;
NK_ASSERT(list->path_count);
memory = nk_buffer_memory(list->buffer);
point = nk_ptr_add(struct nk_vec2, memory, list->path_offset);
point += (list->path_count-1);
return *point;
}